

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source.cpp
# Opt level: O2

void __thiscall ALsource::~ALsource(ALsource *this)

{
  uint *puVar1;
  int *piVar2;
  __pointer_type pBVar3;
  long lVar4;
  long lVar5;
  unique_ptr<BufferlistItem,_std::default_delete<BufferlistItem>_> head;
  unique_ptr<BufferlistItem,_std::default_delete<BufferlistItem>_> local_20;
  
  local_20._M_t.super___uniq_ptr_impl<BufferlistItem,_std::default_delete<BufferlistItem>_>._M_t.
  super__Tuple_impl<0UL,_BufferlistItem_*,_std::default_delete<BufferlistItem>_>.
  super__Head_base<0UL,_BufferlistItem_*,_false>._M_head_impl =
       (__uniq_ptr_data<BufferlistItem,_std::default_delete<BufferlistItem>,_true,_true>)
       (__uniq_ptr_data<BufferlistItem,_std::default_delete<BufferlistItem>,_true,_true>)this->queue
  ;
  while ((tuple<BufferlistItem_*,_std::default_delete<BufferlistItem>_>)
         local_20._M_t.super___uniq_ptr_impl<BufferlistItem,_std::default_delete<BufferlistItem>_>.
         _M_t.super__Tuple_impl<0UL,_BufferlistItem_*,_std::default_delete<BufferlistItem>_>.
         super__Head_base<0UL,_BufferlistItem_*,_false>._M_head_impl !=
         (_Head_base<0UL,_BufferlistItem_*,_false>)0x0) {
    pBVar3 = (((BufferlistItem *)
              local_20._M_t.
              super___uniq_ptr_impl<BufferlistItem,_std::default_delete<BufferlistItem>_>._M_t.
              super__Tuple_impl<0UL,_BufferlistItem_*,_std::default_delete<BufferlistItem>_>.
              super__Head_base<0UL,_BufferlistItem_*,_false>._M_head_impl)->mNext)._M_b._M_p;
    if (((BufferlistItem *)
        local_20._M_t.super___uniq_ptr_impl<BufferlistItem,_std::default_delete<BufferlistItem>_>.
        _M_t.super__Tuple_impl<0UL,_BufferlistItem_*,_std::default_delete<BufferlistItem>_>.
        super__Head_base<0UL,_BufferlistItem_*,_false>._M_head_impl)->mBuffer !=
        (BufferStorage *)0x0) {
      LOCK();
      puVar1 = &((BufferlistItem *)
                local_20._M_t.
                super___uniq_ptr_impl<BufferlistItem,_std::default_delete<BufferlistItem>_>._M_t.
                super__Tuple_impl<0UL,_BufferlistItem_*,_std::default_delete<BufferlistItem>_>.
                super__Head_base<0UL,_BufferlistItem_*,_false>._M_head_impl)->mBuffer[1].mSampleRate
      ;
      *puVar1 = *puVar1 - 1;
      UNLOCK();
    }
    std::unique_ptr<BufferlistItem,_std::default_delete<BufferlistItem>_>::~unique_ptr(&local_20);
    local_20._M_t.super___uniq_ptr_impl<BufferlistItem,_std::default_delete<BufferlistItem>_>._M_t.
    super__Tuple_impl<0UL,_BufferlistItem_*,_std::default_delete<BufferlistItem>_>.
    super__Head_base<0UL,_BufferlistItem_*,_false>._M_head_impl =
         (__uniq_ptr_data<BufferlistItem,_std::default_delete<BufferlistItem>,_true,_true>)
         (__uniq_ptr_data<BufferlistItem,_std::default_delete<BufferlistItem>,_true,_true>)pBVar3;
  }
  this->queue = (BufferlistItem *)0x0;
  for (lVar5 = -0xc0; lVar5 != 0; lVar5 = lVar5 + 0x20) {
    lVar4 = *(long *)((long)&this->Offset + lVar5);
    if (lVar4 != 0) {
      LOCK();
      piVar2 = (int *)(lVar4 + 0x98);
      *piVar2 = *piVar2 + -1;
      UNLOCK();
    }
  }
  return;
}

Assistant:

ALsource::~ALsource()
{
    BufferlistItem *BufferList{queue};
    while(BufferList != nullptr)
    {
        std::unique_ptr<BufferlistItem> head{BufferList};
        BufferList = head->mNext.load(std::memory_order_relaxed);
        if(BufferStorage *buffer{head->mBuffer})
            DecrementRef(BufferFromStorage(buffer)->ref);
    }
    queue = nullptr;

    auto clear_send = [](ALsource::SendData &send) -> void
    { if(send.Slot) DecrementRef(send.Slot->ref); };
    std::for_each(Send.begin(), Send.end(), clear_send);
}